

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_reader.h
# Opt level: O0

bool __thiscall
stl_reader::stl_reader_impl::CoordWithIndex<double,_unsigned_int>::operator<
          (CoordWithIndex<double,_unsigned_int> *this,CoordWithIndex<double,_unsigned_int> *c)

{
  double dVar1;
  CoordWithIndex<double,_unsigned_int> *in_RSI;
  double *in_RDI;
  double dVar2;
  bool local_39;
  bool local_11;
  
  dVar1 = *in_RDI;
  dVar2 = operator[](in_RSI,0);
  local_11 = true;
  if (dVar2 <= dVar1) {
    dVar1 = *in_RDI;
    dVar2 = operator[](in_RSI,0);
    if (((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) &&
       (dVar1 = in_RDI[1], dVar2 = operator[](in_RSI,1), dVar1 < dVar2)) {
      return true;
    }
    dVar1 = *in_RDI;
    dVar2 = operator[](in_RSI,0);
    local_39 = false;
    if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
      dVar1 = in_RDI[1];
      dVar2 = operator[](in_RSI,1);
      local_39 = false;
      if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
        dVar1 = in_RDI[2];
        dVar2 = operator[](in_RSI,2);
        local_39 = dVar1 < dVar2;
      }
    }
    local_11 = local_39;
  }
  return local_11;
}

Assistant:

bool operator < (const CoordWithIndex& c) const
    {
      return (data[0] < c[0])
          || (data[0] == c[0] && data[1] < c[1])
          || (data[0] == c[0] && data[1] == c[1] && data[2] < c[2]);
    }